

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktrade.cpp
# Opt level: O0

void __thiscall Kraken::KTrade::KTrade(KTrade *this,JSONNode *node)

{
  JSONNode *pJVar1;
  char *pcVar2;
  json_number jVar3;
  json_string local_2a8;
  string local_288;
  json_string local_268;
  string local_248;
  json_string local_228;
  string local_208;
  json_string local_1d8;
  string local_1b8;
  istringstream local_198 [384];
  JSONNode *local_18;
  JSONNode *node_local;
  KTrade *this_local;
  
  local_18 = node;
  node_local = (JSONNode *)this;
  std::__cxx11::string::string((string *)&this->misc);
  pJVar1 = ::JSONNode::operator[](node,0);
  jVar3 = ::JSONNode::as_float(pJVar1);
  this->price = jVar3;
  pJVar1 = ::JSONNode::operator[](node,1);
  jVar3 = ::JSONNode::as_float(pJVar1);
  this->volume = jVar3;
  pJVar1 = ::JSONNode::operator[](node,2);
  ::JSONNode::as_string_abi_cxx11_(&local_1d8,pJVar1);
  libjson::to_std_string(&local_1b8,&local_1d8);
  std::__cxx11::istringstream::istringstream(local_198,&local_1b8,8);
  std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_198,&this->time);
  std::__cxx11::istringstream::~istringstream(local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  pJVar1 = ::JSONNode::operator[](node,3);
  ::JSONNode::as_string_abi_cxx11_(&local_228,pJVar1);
  libjson::to_std_string(&local_208,&local_228);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_208);
  this->order = (int)*pcVar2;
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  pJVar1 = ::JSONNode::operator[](node,4);
  ::JSONNode::as_string_abi_cxx11_(&local_268,pJVar1);
  libjson::to_std_string(&local_248,&local_268);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_248);
  this->otype = (int)*pcVar2;
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  pJVar1 = ::JSONNode::operator[](node,5);
  ::JSONNode::as_string_abi_cxx11_(&local_2a8,pJVar1);
  libjson::to_std_string(&local_288,&local_2a8);
  std::__cxx11::string::operator=((string *)&this->misc,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  return;
}

Assistant:

KTrade::KTrade(JSONNode node) 
{
   price  = node[0].as_float();
   volume = node[1].as_float();
   std::istringstream( libjson::to_std_string(node[2].as_string()) ) >> time;
   
   order = static_cast<Order_t>
      ( libjson::to_std_string(node[3].as_string())[0] );
   otype = static_cast<Otype_t>
      ( libjson::to_std_string(node[4].as_string())[0] );
   
   misc = libjson::to_std_string(node[5].as_string()); 
}